

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O2

bool __thiscall MemoryManager::setByteNoCache(MemoryManager *this,uint32_t addr,uint8_t val)

{
  bool bVar1;
  
  bVar1 = isAddrExist(this,addr);
  if (bVar1) {
    *(uint8_t *)
     (*(long *)((long)this->memory[addr >> 0x16] + (ulong)(addr >> 9 & 0x1ff8)) +
     (ulong)(addr & 0xfff)) = val;
  }
  else {
    dbgprintf("Byte write to invalid addr 0x%x!\n",(ulong)addr);
  }
  return bVar1;
}

Assistant:

bool MemoryManager::setByteNoCache(uint32_t addr, uint8_t val) {
  if (!this->isAddrExist(addr)) {
    dbgprintf("Byte write to invalid addr 0x%x!\n", addr);
    return false;
  }

  uint32_t i = this->getFirstEntryId(addr);
  uint32_t j = this->getSecondEntryId(addr);
  uint32_t k = this->getPageOffset(addr);
  this->memory[i][j][k] = val;
  return true;
}